

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

int Aig_ManCiCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  int local_20;
  int nPisOld;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  iVar1 = Aig_ManCiNum(p);
  for (nPisOld = 0; iVar2 = Vec_PtrSize(p->vCis), nPisOld < iVar2; nPisOld = nPisOld + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nPisOld);
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (nPisOld < iVar2 - iVar3) {
      iVar2 = Aig_ObjRefs(pObj_00);
      if (iVar2 < 1) {
        Vec_PtrWriteEntry(p->vObjs,pObj_00->Id,(void *)0x0);
      }
      else {
        Vec_PtrWriteEntry(p->vCis,local_20,pObj_00);
        local_20 = local_20 + 1;
      }
    }
    else {
      Vec_PtrWriteEntry(p->vCis,local_20,pObj_00);
      local_20 = local_20 + 1;
    }
  }
  Vec_PtrShrink(p->vCis,local_20);
  iVar2 = Vec_PtrSize(p->vCis);
  p->nObjs[2] = iVar2;
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 != 0) {
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    p->nTruePis = iVar2 - iVar3;
  }
  iVar2 = Aig_ManCiNum(p);
  return iVar1 - iVar2;
}

Assistant:

int Aig_ManCiCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPisOld = Aig_ManCiNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCis, pObj, i )
    {
        if ( i >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else if ( Aig_ObjRefs(pObj) > 0 )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    }
    Vec_PtrShrink( p->vCis, k );
    p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
    if ( Aig_ManRegNum(p) )
        p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    return nPisOld - Aig_ManCiNum(p);
}